

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

void V_UpdateModeSize(int width,int height)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  int cx2;
  int cx1;
  
  _cx2 = in_RAX;
  V_CalcCleanFacs(0x140,200,width,height,&CleanXfac,&CleanYfac,&cx1,&cx2);
  uVar5 = (ulong)(uint)CleanXfac;
  CleanWidth = width / CleanXfac;
  iVar2 = height / CleanYfac;
  CleanHeight = iVar2;
  if (CleanWidth < 0x140) {
    __assert_fail("CleanWidth >= 320",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                  ,0x52b,"void V_UpdateModeSize(int, int)");
  }
  if (iVar2 < 200) {
    __assert_fail("CleanHeight >= 200",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_video.cpp"
                  ,0x52c,"void V_UpdateModeSize(int, int)");
  }
  if (width - 0x3c0U < 0xffffff60) {
    if (cx1 < cx2) {
      CleanYfac_1 = cx1;
      piVar4 = &CleanXfac_1;
    }
    else {
      iVar2 = 2;
      if (2 < CleanXfac) {
        iVar2 = CleanXfac;
      }
      CleanXfac_1 = iVar2 + -1;
      iVar3 = 2;
      if (2 < CleanYfac) {
        iVar3 = CleanYfac;
      }
      cx1 = iVar3 + -1;
      iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar6 = iVar3 * 3;
      iVar3 = iVar3 * 3 + 3;
      if (-1 < iVar6) {
        iVar3 = iVar6;
      }
      if ((3 < CleanXfac) &&
         (uVar5 = (ulong)(uint)(CleanXfac_1 * 0x140), iVar3 >> 2 < CleanXfac_1 * 0x140)) {
        iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
        iVar6 = iVar3 * 3;
        iVar3 = iVar3 * 3 + 3;
        if (-1 < iVar6) {
          iVar3 = iVar6;
        }
        uVar5 = (ulong)(uint)(iVar3 >> 2);
        iVar6 = iVar2 * 0x140 + -0x280;
        iVar2 = CleanXfac_1;
        do {
          CleanXfac_1 = iVar2 + -1;
          cx1 = cx1 + -1;
          if (iVar2 < 4) break;
          bVar1 = iVar3 >> 2 < iVar6;
          iVar6 = iVar6 + -0x140;
          iVar2 = CleanXfac_1;
        } while (bVar1);
      }
      piVar4 = &CleanYfac_1;
    }
    *piVar4 = cx1;
    CleanWidth_1 = width / CleanXfac_1;
    iVar2 = height / CleanYfac_1;
    piVar4 = (int *)((long)height % (long)CleanYfac_1 & 0xffffffff);
  }
  else {
    CleanXfac_1 = CleanXfac;
    CleanYfac_1 = CleanYfac;
    piVar4 = &CleanWidth_1;
    CleanWidth_1 = CleanWidth;
  }
  R_OldBlend = 0xffffffff;
  CleanHeight_1 = iVar2;
  DisplayWidth = width;
  DisplayHeight = height;
  (*Renderer->_vptr_FRenderer[0xc])(Renderer,uVar5,piVar4);
  return;
}

Assistant:

void V_UpdateModeSize (int width, int height)
{
	int cx1, cx2;
	V_CalcCleanFacs(320, 200, width, height, &CleanXfac, &CleanYfac, &cx1, &cx2);

	CleanWidth = width / CleanXfac;
	CleanHeight = height / CleanYfac;
	assert(CleanWidth >= 320);
	assert(CleanHeight >= 200);

	if (width < 800 || width >= 960)
	{
		if (cx1 < cx2)
		{
			// Special case in which we don't need to scale down.
			CleanXfac_1 = 
			CleanYfac_1 = cx1;
		}
		else
		{
			CleanXfac_1 = MAX(CleanXfac - 1, 1);
			CleanYfac_1 = MAX(CleanYfac - 1, 1);
			// On larger screens this is not enough so make sure it's at most 3/4 of the screen's width
			while (CleanXfac_1 * 320 > screen->GetWidth()*3/4 && CleanXfac_1 > 2)
			{
				CleanXfac_1--;
				CleanYfac_1--;
			}
		}
		CleanWidth_1 = width / CleanXfac_1;
		CleanHeight_1 = height / CleanYfac_1;
	}
	else // if the width is between 800 and 960 the ratio between the screensize and CleanXFac-1 becomes too large.
	{
		CleanXfac_1 = CleanXfac;
		CleanYfac_1 = CleanYfac;
		CleanWidth_1 = CleanWidth;
		CleanHeight_1 = CleanHeight;
	}


	DisplayWidth = width;
	DisplayHeight = height;

	R_OldBlend = ~0;
	Renderer->OnModeSet();
}